

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O1

void DrawRectanglePro(Rectangle rec,Vector2 origin,float rotation,Color color)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 local_b8;
  undefined4 local_a8;
  undefined4 local_98;
  undefined4 local_88;
  undefined4 local_78;
  undefined4 local_68;
  undefined4 local_58;
  undefined4 local_48;
  
  fVar4 = origin.x;
  fVar6 = origin.y;
  local_78 = rec.x;
  local_b8 = rec.y;
  if ((rotation != 0.0) || (NAN(rotation))) {
    local_58 = sinf(rotation * 0.017453292);
    fVar3 = cosf(rotation * 0.017453292);
    fVar7 = rec.width - fVar4;
    local_98 = rec.height - fVar6;
    fVar5 = fVar7 * fVar3 + local_78;
    local_a8 = local_78 - fVar4 * fVar3;
    local_78 = fVar6 * local_58 + local_a8;
    fVar7 = fVar7 * local_58 + local_b8;
    local_68 = local_b8 - fVar4 * local_58;
    local_88 = -fVar6 * fVar3 + local_68;
    local_48 = fVar6 * local_58 + fVar5;
    local_b8 = -fVar6 * fVar3 + fVar7;
    local_58 = -local_98 * local_58;
    local_a8 = local_a8 + local_58;
    local_98 = local_98 * fVar3;
    local_68 = local_68 + local_98;
    local_58 = local_58 + fVar5;
    local_98 = local_98 + fVar7;
  }
  else {
    local_78 = local_78 - fVar4;
    local_b8 = local_b8 - fVar6;
    local_58 = local_78 + rec.width;
    local_68 = local_b8 + rec.height;
    local_88 = local_b8;
    local_48 = local_58;
    local_a8 = local_78;
    local_98 = local_68;
  }
  rlSetTexture(texShapes.id);
  uVar2 = texShapesRec._8_8_;
  uVar1 = texShapesRec._0_8_;
  rlBegin(7);
  rlNormal3f(0.0,0.0,1.0);
  rlColor4ub(color.r,color.g,color.b,color.a);
  local_d8 = (float)uVar1;
  uStack_d4 = SUB84(uVar1,4);
  rlTexCoord2f(local_d8 / (float)texShapes.width,uStack_d4 / (float)texShapes.height);
  rlVertex2f(local_78,local_88);
  local_c8 = (float)uVar2;
  uStack_c4 = SUB84(uVar2,4);
  rlTexCoord2f(local_d8 / (float)texShapes.width,(uStack_c4 + uStack_d4) / (float)texShapes.height);
  rlVertex2f(local_a8,local_68);
  rlTexCoord2f((local_c8 + local_d8) / (float)texShapes.width,
               (uStack_c4 + uStack_d4) / (float)texShapes.height);
  rlVertex2f(local_58,local_98);
  rlTexCoord2f((local_c8 + local_d8) / (float)texShapes.width,uStack_d4 / (float)texShapes.height);
  rlVertex2f(local_48,local_b8);
  rlEnd();
  rlSetTexture(0);
  return;
}

Assistant:

void DrawRectanglePro(Rectangle rec, Vector2 origin, float rotation, Color color)
{
    Vector2 topLeft = { 0 };
    Vector2 topRight = { 0 };
    Vector2 bottomLeft = { 0 };
    Vector2 bottomRight = { 0 };

    // Only calculate rotation if needed
    if (rotation == 0.0f)
    {
        float x = rec.x - origin.x;
        float y = rec.y - origin.y;
        topLeft = (Vector2){ x, y };
        topRight = (Vector2){ x + rec.width, y };
        bottomLeft = (Vector2){ x, y + rec.height };
        bottomRight = (Vector2){ x + rec.width, y + rec.height };
    }
    else
    {
        float sinRotation = sinf(rotation*DEG2RAD);
        float cosRotation = cosf(rotation*DEG2RAD);
        float x = rec.x;
        float y = rec.y;
        float dx = -origin.x;
        float dy = -origin.y;

        topLeft.x = x + dx*cosRotation - dy*sinRotation;
        topLeft.y = y + dx*sinRotation + dy*cosRotation;

        topRight.x = x + (dx + rec.width)*cosRotation - dy*sinRotation;
        topRight.y = y + (dx + rec.width)*sinRotation + dy*cosRotation;

        bottomLeft.x = x + dx*cosRotation - (dy + rec.height)*sinRotation;
        bottomLeft.y = y + dx*sinRotation + (dy + rec.height)*cosRotation;

        bottomRight.x = x + (dx + rec.width)*cosRotation - (dy + rec.height)*sinRotation;
        bottomRight.y = y + (dx + rec.width)*sinRotation + (dy + rec.height)*cosRotation;
    }

#if defined(SUPPORT_QUADS_DRAW_MODE)
    rlSetTexture(GetShapesTexture().id);
    Rectangle shapeRect = GetShapesTextureRectangle();

    rlBegin(RL_QUADS);

        rlNormal3f(0.0f, 0.0f, 1.0f);
        rlColor4ub(color.r, color.g, color.b, color.a);

        rlTexCoord2f(shapeRect.x/texShapes.width, shapeRect.y/texShapes.height);
        rlVertex2f(topLeft.x, topLeft.y);

        rlTexCoord2f(shapeRect.x/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
        rlVertex2f(bottomLeft.x, bottomLeft.y);

        rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
        rlVertex2f(bottomRight.x, bottomRight.y);

        rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, shapeRect.y/texShapes.height);
        rlVertex2f(topRight.x, topRight.y);

    rlEnd();

    rlSetTexture(0);
#else
    rlBegin(RL_TRIANGLES);

        rlColor4ub(color.r, color.g, color.b, color.a);

        rlVertex2f(topLeft.x, topLeft.y);
        rlVertex2f(bottomLeft.x, bottomLeft.y);
        rlVertex2f(topRight.x, topRight.y);

        rlVertex2f(topRight.x, topRight.y);
        rlVertex2f(bottomLeft.x, bottomLeft.y);
        rlVertex2f(bottomRight.x, bottomRight.y);

    rlEnd();
#endif
}